

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * columnTypeImpl(NameContext *pNC,Expr *pExpr,char **pzOrigDb,char **pzOrigTab,char **pzOrigCol
                     )

{
  int *piVar1;
  int iVar2;
  char **in_RCX;
  Expr *in_RDX;
  NameContext *in_RSI;
  long *in_RDI;
  char **in_R8;
  long in_FS_OFFSET;
  bool bVar3;
  Expr *p_1;
  Select *pS_1;
  int iDb;
  Expr *p;
  SrcList *pTabList;
  int iCol;
  Select *pS;
  Table *pTab;
  int j;
  char *zType;
  NameContext sNC_1;
  NameContext sNC;
  char *zOrigCol;
  char *zOrigTab;
  char *zOrigDb;
  undefined2 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef2;
  byte bVar4;
  Column *in_stack_fffffffffffffef8;
  int local_dc;
  long local_d8;
  undefined8 *local_d0;
  int local_c4;
  char **pzOrigCol_00;
  long *local_98;
  long local_90;
  undefined8 local_88;
  long local_58;
  undefined8 local_50;
  long *local_40;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pzOrigCol_00 = (char **)0x0;
  local_10 = 0;
  local_18 = (char *)0x0;
  local_20 = (char *)0x0;
  if (*(char *)&in_RSI->pParse == -0x75) {
    memset(&local_90,0xaa,0x38);
    local_88 = *(undefined8 *)(*(long *)&in_RSI->nRef + 0x28);
    local_90 = *in_RDI;
    pzOrigCol_00 = (char **)columnTypeImpl(in_RSI,in_RDX,in_RCX,in_R8,pzOrigCol_00);
  }
  else if (*(char *)&in_RSI->pParse == -0x58) {
    local_d0 = (undefined8 *)0x0;
    local_d8 = 0;
    local_dc = (int)*(short *)&in_RSI->pWinSelect;
    local_98 = in_RDI;
    while( true ) {
      bVar4 = 0;
      if (local_98 != (long *)0x0) {
        bVar4 = local_d0 != (undefined8 *)0x0 ^ 0xff;
      }
      if ((bVar4 & 1) == 0) break;
      piVar1 = (int *)local_98[1];
      local_c4 = 0;
      while( true ) {
        bVar3 = false;
        if (local_c4 < *piVar1) {
          bVar3 = piVar1[(long)local_c4 * 0x12 + 9] != in_RSI->nNestedSelect;
        }
        if (!bVar3) break;
        local_c4 = local_c4 + 1;
      }
      if (local_c4 < *piVar1) {
        local_d0 = *(undefined8 **)(piVar1 + (long)local_c4 * 0x12 + 6);
        if ((*(ushort *)((long)piVar1 + (long)local_c4 * 0x48 + 0x21) >> 2 & 1) == 0) {
          local_d8 = 0;
        }
        else {
          local_d8 = **(long **)(piVar1 + (long)local_c4 * 0x12 + 0x12);
        }
      }
      else {
        local_98 = (long *)local_98[3];
      }
      in_stack_fffffffffffffef2 = 0;
    }
    if (local_d0 != (undefined8 *)0x0) {
      if (local_d8 == 0) {
        if (local_dc < 0) {
          local_dc = (int)*(short *)((long)local_d0 + 0x34);
        }
        if (local_dc < 0) {
          pzOrigCol_00 = (char **)0x2b891f;
          local_20 = "rowid";
        }
        else {
          local_20 = *(char **)(local_d0[1] + (long)local_dc * 0x10);
          pzOrigCol_00 = (char **)sqlite3ColumnType(in_stack_fffffffffffffef8,
                                                    (char *)(ulong)CONCAT14(0xa8,CONCAT13(bVar4,
                                                  CONCAT12(in_stack_fffffffffffffef2,
                                                           in_stack_fffffffffffffef0))));
        }
        local_18 = (char *)*local_d0;
        if ((*local_98 != 0) && (local_d0[0xc] != 0)) {
          iVar2 = sqlite3SchemaToIndex(*(sqlite3 **)*local_98,(Schema *)local_d0[0xc]);
          local_10 = *(undefined8 *)(*(long *)(*(long *)*local_98 + 0x20) + (long)iVar2 * 0x20);
        }
      }
      else if (local_dc < **(int **)(local_d8 + 0x20)) {
        memset(&local_58,0xaa,0x38);
        local_50 = *(undefined8 *)(local_d8 + 0x28);
        local_40 = local_98;
        local_58 = *local_98;
        pzOrigCol_00 = (char **)columnTypeImpl(in_RSI,in_RDX,in_RCX,in_R8,pzOrigCol_00);
      }
    }
  }
  if (in_RDX != (Expr *)0x0) {
    in_RDX->op = (undefined1)local_10;
    in_RDX->affExpr = local_10._1_1_;
    in_RDX->op2 = local_10._2_1_;
    in_RDX->field_0x3 = local_10._3_1_;
    in_RDX->flags = local_10._4_4_;
    *in_RCX = local_18;
    *in_R8 = local_20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (char *)pzOrigCol_00;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC,
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pSTab;
          if( pTabList->a[j].fg.isSubquery ){
            pS = pTabList->a[j].u4.pSubq->pSelect;
          }else{
            pS = 0;
          }
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && ExprUseYTab(pExpr) && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol<pS->pEList->nExpr
         && (!ViewCanHaveRowid || iCol>=0)
        ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol);
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zCnName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS;
      Expr *p;
      assert( ExprUseXSelect(pExpr) );
      pS = pExpr->x.pSelect;
      p = pS->pEList->a[0].pExpr;
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol);
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}